

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_Empty::_Run(_Test_Empty *this)

{
  WriteBatch *b;
  WriteBatch batch;
  int local_1f4;
  string local_1f0;
  WriteBatch local_1d0;
  Tester local_1b0;
  
  WriteBatch::WriteBatch(&local_1d0);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x3b;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0.ss_);
  PrintContents_abi_cxx11_(&local_1f0,(leveldb *)&local_1d0,b);
  test::Tester::IsEq<char[1],std::__cxx11::string>(&local_1b0,(char (*) [1])0x10d022,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_) !=
      &local_1f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_));
  }
  test::Tester::~Tester(&local_1b0);
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
  ;
  local_1b0.line_ = 0x3c;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0.ss_);
  local_1f0._M_dataplus._M_p._0_4_ = 0;
  local_1f4 = WriteBatchInternal::Count(&local_1d0);
  test::Tester::IsEq<int,int>(&local_1b0,(int *)&local_1f0,&local_1f4);
  test::Tester::~Tester(&local_1b0);
  WriteBatch::~WriteBatch(&local_1d0);
  return;
}

Assistant:

TEST(WriteBatchTest, Empty) {
  WriteBatch batch;
  ASSERT_EQ("", PrintContents(&batch));
  ASSERT_EQ(0, WriteBatchInternal::Count(&batch));
}